

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> * __thiscall
pbrt::ParameterDictionary::
lookupArray<pbrt::Point3<float>,pstd::vector<double,pstd::pmr::polymorphic_allocator<double>>const&(*)(pbrt::ParsedParameter_const&),pbrt::Point3<float>(*)(double_const*,pbrt::FileLoc_const*)>
          (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
           *__return_storage_ptr__,ParameterDictionary *this,string *name,ParameterType type,
          char *typeName,int nPerItem,
          _func_vector<double,_pstd::pmr::polymorphic_allocator<double>_>_ptr_ParsedParameter_ptr
          *getValues,_func_Point3<float>_double_ptr_FileLoc_ptr *convert)

{
  string *__lhs;
  undefined8 uVar1;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar2;
  size_t sVar3;
  ParsedParameter *__lhs_00;
  ulong uVar4;
  pointer pPVar5;
  __type _Var6;
  bool bVar7;
  long lVar8;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  undefined1 auVar13 [64];
  undefined4 in_XMM1_Da;
  allocator_type local_49;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *local_48;
  vector<double,_pstd::pmr::polymorphic_allocator<double>_> *local_40;
  int local_38;
  int local_34;
  undefined1 extraout_var [56];
  
  paVar2 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar3 = (this->params).nStored;
  paVar9 = &(this->params).field_2;
  if (paVar2 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar9 = paVar2;
  }
  lVar11 = 0;
  local_48 = __return_storage_ptr__;
  local_40 = (vector<double,_pstd::pmr::polymorphic_allocator<double>_> *)typeName;
  local_38 = nPerItem;
  while( true ) {
    if (sVar3 << 3 == lVar11) {
      (local_48->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_48->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_48->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      return local_48;
    }
    __lhs_00 = *(ParsedParameter **)((long)paVar9 + lVar11);
    __lhs = &__lhs_00->name;
    _Var6 = std::operator==(__lhs,name);
    if ((_Var6) && (bVar7 = std::operator==(&__lhs_00->type,(char *)local_40), bVar7)) break;
    lVar11 = lVar11 + 8;
  }
  local_40 = (*getValues)(__lhs_00);
  local_34 = local_38;
  uVar4 = local_40->nStored;
  if (uVar4 != 0) {
    uVar10 = (ulong)local_38;
    if (uVar4 % uVar10 == 0) {
      __lhs_00->lookedUp = true;
      std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::vector
                (local_48,uVar4 / uVar10,&local_49);
      lVar11 = 8;
      lVar8 = 0;
      uVar12 = 0;
      while (uVar12 < uVar4 / uVar10) {
        auVar13._0_8_ = (*convert)((double *)((long)local_40->ptr + lVar8),&__lhs_00->loc);
        auVar13._8_56_ = extraout_var;
        uVar12 = uVar12 + 1;
        lVar8 = lVar8 + uVar10 * 8;
        pPVar5 = (local_48->
                 super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar1 = vmovlps_avx(auVar13._0_16_);
        *(undefined8 *)((long)pPVar5 + lVar11 + -8) = uVar1;
        *(undefined4 *)((long)&(pPVar5->super_Tuple3<pbrt::Point3,_float>).x + lVar11) = in_XMM1_Da;
        lVar11 = lVar11 + 0xc;
      }
      return local_48;
    }
    ErrorExit<std::__cxx11::string_const&,int&>
              (&__lhs_00->loc,"Number of values provided for \"%s\" not a multiple of %d",__lhs,
               &local_34);
  }
  ErrorExit<std::__cxx11::string_const&>(&__lhs_00->loc,"No values provided for \"%s\".",__lhs);
}

Assistant:

std::vector<ReturnType> ParameterDictionary::lookupArray(const std::string &name,
                                                         ParameterType type,
                                                         const char *typeName,
                                                         int nPerItem, G getValues,
                                                         C convert) const {
    for (const ParsedParameter *p : params)
        if (p->name == name && p->type == typeName)
            return returnArray<ReturnType>(getValues(*p), *p, nPerItem, convert);

    return {};
}